

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  double dVar3;
  
  lVar1 = std::cout;
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0x3c;
  poVar2 = std::ostream::_M_insert<double>(2.220446049250313e-16);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(0.9999999999999998);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(1.9999999999999998);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(3.9999999999999996);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(8.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(16.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(32.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<double>(64.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar3 = nextafter(0.1,0.0);
  poVar2 = std::operator<<((ostream *)&std::cout,"The number 0.1 lies between two valid doubles:\n")
  ;
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 0x38;
  std::operator<<(poVar2,"    ");
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) | 0x104;
  std::operator<<(poVar2," (");
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  poVar2 = std::operator<<(poVar2,')');
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb;
  std::operator<<(poVar2,"\nand ");
  poVar2 = std::ostream::_M_insert<double>(0.1);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) | 0x104;
  std::operator<<(poVar2,"  (");
  poVar2 = std::ostream::_M_insert<double>(0.1);
  poVar2 = std::operator<<(poVar2,")\n");
  lVar1 = *(long *)poVar2;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 8) = 0x14;
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

  /*
  Machine Epsilon is the machine-dependent  difference between 1.0 and the
  smallest representable value that is greater than 1.0.

  */

  std::cout << std::fixed << std::setprecision(60);
  std::cout << std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 1.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 2.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 4.0 - 2*std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 8.0 - 2*std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 16.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 32.0 - std::numeric_limits<double>::epsilon() << std::endl;
  std::cout << 64.0 - std::numeric_limits<double>::epsilon() << std::endl;

  double from3 = std::nextafter(0.1, 0), to3 = 0.1;
      std::cout << "The number 0.1 lies between two valid doubles:\n"
                << std::setprecision(56) << "    " << from3
                << std::hexfloat << " (" << from3 << ')' << std::defaultfloat
                << "\nand " << to3 << std::hexfloat << "  (" << to3 << ")\n"
                << std::defaultfloat << std::setprecision(20);



  return 0;
}